

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD3Importer::~MD3Importer(MD3Importer *this)

{
  MD3Importer *this_local;
  
  ~MD3Importer(this);
  operator_delete(this);
  return;
}

Assistant:

MD3Importer::~MD3Importer()
{}